

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

uint RDL_getEdgesForRingsystem(RDL_data *data,uint idx,RDL_edge **edges)

{
  uint uVar1;
  RDL_BCCGraph *pRVar2;
  RDL_graph *pRVar3;
  RDL_node *pRVar4;
  RDL_edge *paRVar5;
  ulong uVar6;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
  }
  else {
    if (idx < data->bccGraphs->nof_bcc) {
      paRVar5 = (RDL_edge *)malloc((ulong)data->bccGraphs->bcc_graphs[idx]->E << 3);
      *edges = paRVar5;
      pRVar2 = data->bccGraphs;
      pRVar3 = pRVar2->bcc_graphs[idx];
      for (uVar6 = 0; uVar1 = pRVar3->E, uVar6 < uVar1; uVar6 = uVar6 + 1) {
        pRVar4 = data->graph->edges[pRVar2->edge_from_bcc_mapping[idx][uVar6]];
        paRVar5[uVar6][0] = *pRVar4;
        paRVar5[uVar6][1] = pRVar4[1];
      }
      return uVar1;
    }
    (*RDL_outputFunc)(RDL_ERROR,"idx %d is out of range!\n");
  }
  paRVar5 = (RDL_edge *)malloc(8);
  *edges = paRVar5;
  return 0xffffffff;
}

Assistant:

unsigned RDL_getEdgesForRingsystem(
    const RDL_data *data, unsigned idx, RDL_edge** edges)
{
  unsigned i, edge;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*edges) = malloc(sizeof(**edges));
    return RDL_INVALID_RESULT;
  }

  if(idx >= data->bccGraphs->nof_bcc) {
    RDL_outputFunc(RDL_ERROR, "idx %d is out of range!\n", idx);
    (*edges) = malloc(sizeof(**edges));
    return RDL_INVALID_RESULT;
  }

  (*edges) = malloc(data->bccGraphs->bcc_graphs[idx]->E * sizeof(**edges));

  for (i = 0; i < data->bccGraphs->bcc_graphs[idx]->E; ++i) {
    edge = data->bccGraphs->edge_from_bcc_mapping[idx][i];
    (*edges)[i][0] = data->graph->edges[edge][0];
    (*edges)[i][1] = data->graph->edges[edge][1];
  }

  return data->bccGraphs->bcc_graphs[idx]->E;
}